

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS
ref_metric_buffer_at_complexity(REF_DBL *metric,REF_GRID ref_grid,REF_DBL target_complexity)

{
  REF_NODE pRVar1;
  uint uVar2;
  undefined8 uVar3;
  int iVar4;
  REF_DBL *metric_00;
  char *pcVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  REF_DBL current_complexity;
  REF_DBL *local_60;
  REF_DBL local_58;
  REF_DBL local_48;
  
  pRVar1 = ref_grid->node;
  local_58 = target_complexity;
  if (target_complexity <= -target_complexity) {
    local_58 = -target_complexity;
  }
  iVar4 = 0;
  local_60 = metric;
  local_48 = target_complexity;
  while( true ) {
    metric_00 = local_60;
    if (iVar4 == 10) {
      return 0;
    }
    uVar2 = ref_metric_buffer(local_60,ref_grid);
    if (uVar2 != 0) break;
    uVar2 = ref_metric_complexity(metric_00,ref_grid,&current_complexity);
    if (uVar2 != 0) {
      pcVar5 = "cmp";
      uVar3 = 0x8b2;
      goto LAB_001aedbf;
    }
    dVar8 = current_complexity * 1e+20;
    if (dVar8 <= -dVar8) {
      dVar8 = -dVar8;
    }
    if (dVar8 <= local_58) {
      return 4;
    }
    for (lVar6 = 0; lVar6 < pRVar1->max; lVar6 = lVar6 + 1) {
      if (-1 < pRVar1->global[lVar6]) {
        for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
          dVar8 = pow(local_48 / current_complexity,0.6666666666666666);
          metric_00[lVar7] = dVar8 * metric_00[lVar7];
        }
      }
      metric_00 = metric_00 + 6;
    }
    iVar4 = iVar4 + 1;
  }
  pcVar5 = "buffer";
  uVar3 = 0x8b1;
LAB_001aedbf:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar3,
         "ref_metric_buffer_at_complexity",(ulong)uVar2,pcVar5);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_metric_buffer_at_complexity(REF_DBL *metric,
                                                   REF_GRID ref_grid,
                                                   REF_DBL target_complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node, relaxations;
  REF_DBL current_complexity;

  /* global scaling and buffer */
  for (relaxations = 0; relaxations < 10; relaxations++) {
    RSS(ref_metric_buffer(metric, ref_grid), "buffer");
    RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
    if (!ref_math_divisible(target_complexity, current_complexity)) {
      return REF_DIV_ZERO;
    }
    each_ref_node_valid_node(ref_node, node) for (i = 0; i < 6; i++) {
      metric[i + 6 * node] *=
          pow(target_complexity / current_complexity, 2.0 / 3.0);
    }
  }

  return REF_SUCCESS;
}